

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

node * mpt::node::create(size_t len)

{
  NodePrivate *this;
  node *this_00;
  
  if (len - 0x11 < 0x48) {
    this = (NodePrivate *)malloc(0x80);
    if (this != (NodePrivate *)0x0) {
      NodePrivate::NodePrivate(this);
      return &this->super_node;
    }
  }
  else {
    this_00 = (node *)malloc(0x38);
    if (this_00 != (node *)0x0) {
      node(this_00,(metatype *)0x0);
      return this_00;
    }
  }
  return (node *)0x0;
}

Assistant:

node *node::create(size_t len)
{
	static const size_t preSize = sizeof(node) - sizeof(identifier);
	void *ptr;
	len += preSize;
	if (len > sizeof(node) && len <= sizeof(NodePrivate)) {
		if (!(ptr = (malloc(sizeof(NodePrivate))))) {
			return 0;
		}
		return new (ptr) NodePrivate();
	}
	if (!(ptr = malloc(sizeof(node)))) {
		return 0;
	}
	return new (ptr) node();
}